

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_sources(options_i *options,vw *all,io_buf *model,bool skipModelLoad)

{
  byte bVar1;
  undefined7 in_register_00000009;
  uint32_t *puVar2;
  input_options parsed_source_options;
  
  if ((int)CONCAT71(in_register_00000009,skipModelLoad) == 0) {
    load_input_model(all,model);
  }
  else {
    (*model->_vptr_io_buf[8])(model);
  }
  parse_source(&parsed_source_options,all,options);
  enable_sources(all,all->quiet,all->numpasses,&parsed_source_options);
  bVar1 = 0xff;
  do {
    bVar1 = bVar1 + 1;
  } while ((ulong)(1L << (bVar1 & 0x3f)) < *(ulong *)(all->l + 0xe0));
  puVar2 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar2 = &(all->weights).sparse_weights._stride_shift;
  }
  all->wpp = (1 << (bVar1 & 0x1f)) >> ((byte)*puVar2 & 0x1f);
  input_options::~input_options(&parsed_source_options);
  return;
}

Assistant:

void parse_sources(options_i& options, vw& all, io_buf& model, bool skipModelLoad)
{
  if (!skipModelLoad)
    load_input_model(all, model);
  else
    model.close_file();

  auto parsed_source_options = parse_source(all, options);
  enable_sources(all, all.quiet, all.numpasses, parsed_source_options);

  // force wpp to be a power of 2 to avoid 32-bit overflow
  uint32_t i = 0;
  size_t params_per_problem = all.l->increment;
  while (params_per_problem > ((uint64_t)1 << i)) i++;
  all.wpp = (1 << i) >> all.weights.stride_shift();
}